

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsim.cpp
# Opt level: O0

void simulate_step(int64_t k,int32_t randomize_states_that_are_inputs)

{
  value_type pBVar1;
  ulong uVar2;
  int64_t iVar3;
  _Bool _Var4;
  bool bVar5;
  uint32_t uVar6;
  size_type sVar7;
  reference ppBVar8;
  anon_union_8_2_8be7de1a_for_BtorSimState_2 aVar9;
  reference pvVar10;
  reference pvVar11;
  undefined8 uVar12;
  long lVar13;
  int in_ESI;
  char *__filename;
  int64_t in_RDI;
  BtorSimState BVar14;
  int64_t unaff_retaddr;
  Btor2Line *l_1;
  int i_4;
  BtorSimState s_3;
  BtorSimVCDWriter *in_stack_00000080;
  pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  it;
  iterator __end1;
  iterator __begin1;
  map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  int64_t bound;
  BtorSimState s_2;
  Btor2Line *bad;
  int64_t r;
  size_t i_3;
  BtorSimState s_1;
  Btor2Line *constraint;
  size_t i_2;
  Btor2Line *le;
  Btor2Line *li;
  uint32_t width;
  BtorSimState update;
  Btor2Line *next;
  Btor2Line *state;
  size_t i_1;
  BtorSimState s;
  Btor2Line *l;
  int64_t i;
  undefined4 in_stack_fffffffffffffe58;
  uint32_t in_stack_fffffffffffffe5c;
  BtorSimArrayModel *in_stack_fffffffffffffe60;
  int local_140;
  size_type local_120;
  _Self local_f8;
  _Self local_f0;
  ulong local_b8;
  ulong local_98;
  undefined4 uStack_64;
  BtorSimState local_58;
  value_type local_48;
  value_type local_40;
  ulong local_38;
  BtorSimState local_30;
  long local_20;
  char *local_18;
  int local_c;
  int64_t local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  msg(1,"simulating step %ld",in_RDI);
  for (local_18 = (char *)0x0; (long)local_18 < num_format_lines; local_18 = local_18 + 1) {
    __filename = local_18;
    local_20 = btor2parser_get_line_by_id(model);
    if ((((((local_20 != 0) && (*(int *)(local_20 + 0x18) != 0x2d)) &&
          (*(int *)(local_20 + 0x18) != 0xe)) &&
         ((*(int *)(local_20 + 0x18) != 0x16 && (*(int *)(local_20 + 0x18) != 2)))) &&
        ((*(int *)(local_20 + 0x18) != 5 &&
         ((*(int *)(local_20 + 0x18) != 10 && (*(int *)(local_20 + 0x18) != 0x11)))))) &&
       (*(int *)(local_20 + 0x18) != 0x1c)) {
      BVar14 = simulate(unaff_retaddr);
      local_30.field_1 = BVar14.field_1;
      local_30.type = BVar14.type;
      BtorSimState::remove(&local_30,__filename);
    }
  }
  for (local_38 = 0; uVar2 = local_38,
      sVar7 = std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>::size(&states), uVar2 < sVar7;
      local_38 = local_38 + 1) {
    ppBVar8 = std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>::operator[](&states,local_38);
    local_40 = *ppBVar8;
    ppBVar8 = std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>::operator[]
                        (&nexts,local_40->id);
    local_48 = *ppBVar8;
    BtorSimState::BtorSimState(&local_58);
    if (local_48 == (value_type)0x0) {
      if ((local_40->sort).tag == BTOR2_TAG_SORT_bitvec) {
        local_58.type = BITVEC;
        if (local_c == 0) {
          local_58.field_1.bv_state =
               btorsim_bv_new((uint32_t)((ulong)in_stack_fffffffffffffe60 >> 0x20));
        }
        else {
          local_58.field_1.array_state =
               (BtorSimArrayModel *)
               btorsim_bv_new_random(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
        }
      }
      else {
        local_58.type = ARRAY;
        btor2parser_get_line_by_id(model,(local_40->sort).field_3.array.index);
        btor2parser_get_line_by_id(model,(local_40->sort).field_3.array.element);
        aVar9.bv_state = (BtorSimBitVector *)operator_new(0x58);
        BtorSimArrayModel::BtorSimArrayModel
                  (in_stack_fffffffffffffe60,
                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),0x130734);
        local_58.field_1.bv_state = aVar9.bv_state;
        if (local_c != 0) {
          uVar6 = btorsim_rng_rand(&rng);
          (local_58.field_1.array_state)->random_seed = (ulong)uVar6;
        }
      }
    }
    else {
      BVar14 = simulate(unaff_retaddr);
      local_58._4_4_ = uStack_64;
      local_58.type = BVar14.type;
      local_58.field_1 = BVar14.field_1;
    }
    pvVar10 = std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                        (&next_state,local_40->id);
    pvVar10->type = local_58.type;
    *(undefined4 *)&pvVar10->field_0x4 = local_58._4_4_;
    pvVar10->field_1 = local_58.field_1;
  }
  if (constraints_violated < 0) {
    for (local_98 = 0;
        sVar7 = std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>::size(&constraints),
        local_98 < sVar7; local_98 = local_98 + 1) {
      ppBVar8 = std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>::operator[]
                          (&constraints,local_98);
      pBVar1 = *ppBVar8;
      pvVar10 = std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                          (&current_state,*pBVar1->args);
      _Var4 = btorsim_bv_is_zero((pvVar10->field_1).bv_state);
      if (_Var4) {
        msg(1,"constraint(%ld) \'%ld constraint %ld\' violated at time %ld",local_98,pBVar1->id,
            *pBVar1->args,local_8);
        constraints_violated = local_8;
      }
    }
  }
  if (constraints_violated < 0) {
    for (local_b8 = 0; sVar7 = std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>::size(&bads),
        local_b8 < sVar7; local_b8 = local_b8 + 1) {
      pvVar11 = std::vector<long,_std::allocator<long>_>::operator[](&reached_bads,local_b8);
      if (*pvVar11 < 0) {
        ppBVar8 = std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>::operator[](&bads,local_b8)
        ;
        pvVar10 = std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                            (&current_state,*(*ppBVar8)->args);
        _Var4 = btorsim_bv_is_zero((pvVar10->field_1).bv_state);
        if ((!_Var4) &&
           (pvVar11 = std::vector<long,_std::allocator<long>_>::operator[](&reached_bads,local_b8),
           iVar3 = local_8, *pvVar11 < 0)) {
          pvVar11 = std::vector<long,_std::allocator<long>_>::operator[](&reached_bads,local_b8);
          *pvVar11 = iVar3;
          num_unreached_bads = num_unreached_bads + -1;
          if (num_unreached_bads == 0) {
            sVar7 = std::vector<Btor2Line_*,_std::allocator<Btor2Line_*>_>::size(&bads);
            msg(1,"all %ld bad state properties reached",sVar7);
          }
        }
      }
    }
  }
  local_f0._M_node =
       (_Base_ptr)
       std::
       map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin((map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  local_f8._M_node =
       (_Base_ptr)
       std::
       map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end((map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  while (bVar5 = std::operator!=(&local_f0,&local_f8), bVar5) {
    std::
    _Rb_tree_iterator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x130ad2);
    std::
    pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair((pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)in_stack_fffffffffffffe60,
           (pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    pvVar10 = std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                        (&current_state,local_120);
    _Var4 = btorsim_bv_is_zero((pvVar10->field_1).bv_state);
    if (!_Var4) {
      uVar12 = std::__cxx11::string::c_str();
      printf("[btorsim] Assert failed in test: %s (step %ld)\n",uVar12,local_8);
    }
    std::
    pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x130b85);
    std::
    _Rb_tree_iterator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_fffffffffffffe60);
  }
  if ((dump_vcd & 1U) != 0) {
    for (local_140 = 0; local_140 < num_format_lines; local_140 = local_140 + 1) {
      lVar13 = btor2parser_get_line_by_id(model,(long)local_140);
      if (((((lVar13 != 0) && (*(int *)(lVar13 + 0x18) != 0x2d)) && (*(int *)(lVar13 + 0x18) != 0xe)
           ) && (((*(int *)(lVar13 + 0x18) != 0x16 && (*(int *)(lVar13 + 0x18) != 2)) &&
                 ((*(int *)(lVar13 + 0x18) != 5 &&
                  ((*(int *)(lVar13 + 0x18) != 10 && (*(int *)(lVar13 + 0x18) != 0x11)))))))) &&
         (*(long *)(lVar13 + 0x60) != 0)) {
        std::vector<BtorSimState,_std::allocator<BtorSimState>_>::operator[]
                  (&current_state,(long)local_140);
        BtorSimVCDWriter::add_value_change
                  (in_stack_00000080,(int64_t)s_3.field_1,s_3._0_8_,(BtorSimState)it._0_16_);
      }
    }
  }
  return;
}

Assistant:

static void
simulate_step (int64_t k, int32_t randomize_states_that_are_inputs)
{
  msg (1, "simulating step %" PRId64, k);
  for (int64_t i = 0; i < num_format_lines; i++)
  {
    Btor2Line *l = btor2parser_get_line_by_id (model, i);
    if (!l) continue;
    if (l->tag == BTOR2_TAG_sort || l->tag == BTOR2_TAG_init
        || l->tag == BTOR2_TAG_next || l->tag == BTOR2_TAG_bad
        || l->tag == BTOR2_TAG_constraint || l->tag == BTOR2_TAG_fair
        || l->tag == BTOR2_TAG_justice || l->tag == BTOR2_TAG_output)
      continue;

    BtorSimState s = simulate (i);
#if 0
    printf ("[btorim] %" PRId64 " %s ", l->id, l->name);
    if(s.type == BtorSimState::Type::BITVEC) btorsim_bv_print (s.bv_state);
    fflush (stdout);
#endif
    s.remove ();
  }
  for (size_t i = 0; i < states.size (); i++)
  {
    Btor2Line *state = states[i];
    assert (0 <= state->id), assert (state->id < num_format_lines);
    Btor2Line *next = nexts[state->id];
    BtorSimState update;
    if (next)
    {
      assert (next->nargs == 2);
      assert (next->args[0] == state->id);
      update = simulate (next->args[1]);
    }
    else
    {
      if (state->sort.tag == BTOR2_TAG_SORT_bitvec)
      {
        update.type    = BtorSimState::Type::BITVEC;
        uint32_t width = state->sort.bitvec.width;
        if (randomize_states_that_are_inputs)
          update.bv_state = btorsim_bv_new_random (&rng, width);
        else
          update.bv_state = btorsim_bv_new (width);
      }
      else
      {
        assert (state->sort.tag == BTOR2_TAG_SORT_array);
        update.type = BtorSimState::Type::ARRAY;
        Btor2Line *li =
            btor2parser_get_line_by_id (model, state->sort.array.index);
        Btor2Line *le =
            btor2parser_get_line_by_id (model, state->sort.array.element);
        assert (li->sort.tag == BTOR2_TAG_SORT_bitvec);
        assert (le->sort.tag == BTOR2_TAG_SORT_bitvec);
        update.array_state = new BtorSimArrayModel (li->sort.bitvec.width,
                                                    le->sort.bitvec.width);
        if (randomize_states_that_are_inputs)
          update.array_state->random_seed = btorsim_rng_rand (&rng);
      }
    }
    assert (!next_state[state->id].is_set ());
    assert (next_state[state->id].type == update.type);
    next_state[state->id] = update;
  }

  if (constraints_violated < 0)
  {
    for (size_t i = 0; i < constraints.size (); i++)
    {
      Btor2Line *constraint = constraints[i];
      BtorSimState s        = current_state[constraint->args[0]];
      assert (s.type == BtorSimState::Type::BITVEC);
      if (!btorsim_bv_is_zero (s.bv_state)) continue;
      msg (1,
           "constraint(%" PRId64 ") '%" PRId64 " constraint %" PRId64
           "' violated at time %" PRId64,
           i,
           constraint->id,
           constraint->args[0],
           k);
      constraints_violated = k;
    }
  }

  if (constraints_violated < 0)
  {
    for (size_t i = 0; i < bads.size (); i++)
    {
      int64_t r = reached_bads[i];
      if (r >= 0) continue;
      Btor2Line *bad = bads[i];
      BtorSimState s = current_state[bad->args[0]];
      assert (s.type == BtorSimState::Type::BITVEC);
      if (btorsim_bv_is_zero (s.bv_state)) continue;
      int64_t bound = reached_bads[i];
      if (bound >= 0) continue;
      reached_bads[i] = k;
      assert (num_unreached_bads > 0);
      if (!--num_unreached_bads)
        msg (1,
             "all %" PRId64 " bad state properties reached",
             (int64_t) bads.size ());
    }
  }

  /* Check additional bads from info file */
  for (auto it : extra_constraints)
  {
    BtorSimState s = current_state[it.first];
    assert (s.type == BtorSimState::Type::BITVEC);
    if (btorsim_bv_is_zero (s.bv_state)) continue;
    printf ("[btorsim] Assert failed in test: %s (step %" PRId64 ")\n",
            it.second.c_str (),
            k);
  }

  if (dump_vcd)
  {
    for (int i = 0; i < num_format_lines; i++)
    {
      Btor2Line *l = btor2parser_get_line_by_id (model, i);
      if (!l) continue;
      // these are not signals
      if (l->tag == BTOR2_TAG_sort || l->tag == BTOR2_TAG_init
          || l->tag == BTOR2_TAG_next || l->tag == BTOR2_TAG_bad
          || l->tag == BTOR2_TAG_constraint || l->tag == BTOR2_TAG_fair
          || l->tag == BTOR2_TAG_justice)
        continue;
      // only add named signals
      if (!l->symbol) continue;
      vcd_writer->add_value_change (k, i, current_state[i]);
    }
  }
}